

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Get
          (PersistentStorageJson *this,NetworkId *aId,Network *aRetValue)

{
  Status SVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,JSON_NWK_abi_cxx11_,DAT_0028f4d8 + JSON_NWK_abi_cxx11_);
  SVar1 = GetId<ot::commissioner::persistent_storage::Network,ot::commissioner::persistent_storage::NetworkId>
                    (this,aId,aRetValue,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Get(NetworkId const &aId, Network &aRetValue)
{
    return GetId<Network, NetworkId>(aId, aRetValue, JSON_NWK);
}